

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgconvert.cpp
# Opt level: O3

string * __thiscall Converter::header_abi_cxx11_(string *__return_storage_ptr__,Converter *this)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer puVar6;
  pointer puVar7;
  size_type sVar8;
  string result;
  string guard;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  pcVar1 = (this->_name)._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->_name)._M_string_length);
  _Var2._M_p = local_80._M_dataplus._M_p;
  if (local_80._M_string_length != 0) {
    sVar8 = 0;
    do {
      iVar3 = toupper((int)_Var2._M_p[sVar8]);
      _Var2._M_p[sVar8] = (char)iVar3;
      sVar8 = sVar8 + 1;
    } while (local_80._M_string_length != sVar8);
  }
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x1233ac);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_a0.field_2._M_allocated_capacity = *psVar5;
    local_a0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar5;
    local_a0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_a0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar4 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar4 == args) {
    local_58.field_2._M_allocated_capacity = (size_type)(args->_M_dataplus)._M_p;
    local_58.field_2._8_8_ = plVar4[3];
  }
  else {
    local_58.field_2._M_allocated_capacity = (size_type)(args->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_58._M_string_length = plVar4[1];
  *plVar4 = (long)args;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tinyformat::format<std::__cxx11::string>
            (&local_a0,(tinyformat *)"#ifndef %s\n",(char *)&local_58,args);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  tinyformat::format<std::__cxx11::string>
            (&local_a0,(tinyformat *)"#define %s\n",(char *)&local_58,args);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_60 = &this->_name;
  tinyformat::format<std::__cxx11::string>
            (&local_a0,(tinyformat *)"static uint8_t %s_bitmap[] = {\n",(char *)local_60,args);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  puVar6 = (this->_bitmap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->_bitmap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar6) {
    puVar7 = (pointer)0x0;
    do {
      if (((ulong)puVar7 & 0xf) == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        puVar6 = (this->_bitmap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      tinyformat::format<unsigned_char>(&local_a0,"0x%02x",puVar6 + (long)puVar7);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (puVar7 == (this->_bitmap).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                    ~(ulong)(this->_bitmap).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) break;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((int)((ulong)puVar7 & 0xf) == 0xf) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      puVar7 = puVar7 + 1;
      puVar6 = (this->_bitmap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (puVar7 < (this->_bitmap).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish + -(long)puVar6);
  }
  tinyformat::format<>(&local_a0,"\n};\n");
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  tinyformat::format<std::__cxx11::string>
            (&local_a0,(tinyformat *)"static BitmapIcon %s = {\n",(char *)local_60,args);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  tinyformat::format<int,int,int,std::__cxx11::string>
            (&local_a0,(tinyformat *)"    %d, %d, %d, %s_bitmap\n",(char *)&this->_width,
             &this->_height,&this->_bpp,(int *)local_60,in_stack_ffffffffffffff58);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::operator+(&local_80,"#endif // ",&local_58);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_a0.field_2._M_allocated_capacity = *psVar5;
    local_a0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar5;
    local_a0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_a0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string header() const {
        std::string guard = "__" + toUpperCase(_name) + "_H__";

        std::string result;
        result += tfm::format("#ifndef %s\n", guard);
        result += tfm::format("#define %s\n", guard);
        result += "\n";
        result += "#include \"BitmapIcon.h\"\n";
        result += "\n";

        result += tfm::format("static uint8_t %s_bitmap[] = {\n", _name);
        for (size_t i = 0; i < _bitmap.size(); ++i) {
            if (i % 16 == 0) {
                result += "    ";
            }
            result += tfm::format("0x%02x", _bitmap[i]);
            if (i == _bitmap.size() - 1) {
                break;
            }
            result += ", ";
            if (i % 16 == 15) {
                result += "\n";
            }
        }
        result += tfm::format("\n};\n");
        result += "\n";

        result += tfm::format("static BitmapIcon %s = {\n", _name);
        result += tfm::format("    %d, %d, %d, %s_bitmap\n", _width, _height, _bpp, _name);
        result += "};\n";

        result += "\n";
        result += "#endif // " + guard + "\n";

        return result;
    }